

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

bool __thiscall
pybind11::detail::
string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
::load(string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
       *this,handle src,bool param_2)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  object utfNbytes;
  object local_48;
  long *local_40 [2];
  long local_30 [2];
  
  if (src.m_ptr == (PyObject *)0x0) {
    bVar1 = false;
  }
  else {
    if (((src.m_ptr)->ob_type->tp_flags & 0x10000000) == 0) {
      bVar1 = load_bytes<char>(this,(enable_if_t<std::is_same<char,_char>::value,_handle>)src.m_ptr)
      ;
      return bVar1;
    }
    local_48.super_handle.m_ptr = (handle)PyUnicode_AsEncodedString(src.m_ptr,"utf-8",0);
    bVar1 = local_48.super_handle.m_ptr != (PyObject *)0x0;
    if (local_48.super_handle.m_ptr == (PyObject *)0x0) {
      PyErr_Clear();
    }
    else {
      lVar2 = PyBytes_AsString(local_48.super_handle.m_ptr);
      lVar3 = PyBytes_Size(local_48.super_handle.m_ptr);
      local_40[0] = local_30;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_40,lVar2,lVar3 + lVar2);
      std::__cxx11::string::operator=((string *)this,(string *)local_40);
      if (local_40[0] != local_30) {
        operator_delete(local_40[0],local_30[0] + 1);
      }
    }
    object::~object(&local_48);
  }
  return bVar1;
}

Assistant:

static typename std::enable_if<!std::is_floating_point<U>::value && std::is_unsigned<U>::value && (sizeof(U) <= sizeof(unsigned long)), handle>::type
    cast(U src, return_value_policy /* policy */, handle /* parent */) {
        return PYBIND11_LONG_FROM_UNSIGNED((unsigned long) src);
    }